

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_palignr_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s,int32_t shift)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  ulong uVar6;
  
  if (0x1f < shift) {
    uVar5 = 0;
    uVar4 = 0;
    goto LAB_00510de8;
  }
  uVar2 = shift * 8;
  bVar1 = (byte)uVar2;
  if (shift * 8 + 0x3fU < 0x7f) {
    if (shift << 3 < 1) {
      uVar4 = s->_q_ZMMReg[0] << (-bVar1 & 0x3f);
      if (uVar2 < 0xffffff81) {
        uVar3 = 0;
      }
      else {
        if ((int)uVar2 < -0x3f) {
LAB_00510dcc:
          uVar3 = s->_q_ZMMReg[0] << (-bVar1 & 0x3f);
          goto LAB_00510de2;
        }
        uVar3 = s->_q_ZMMReg[0] >> (bVar1 + 0x40 & 0x3f);
      }
      uVar3 = s->_q_ZMMReg[1] << (-bVar1 & 0x3f) | uVar3;
    }
    else {
      uVar4 = s->_q_ZMMReg[0] >> (bVar1 & 0x3f) | s->_q_ZMMReg[1] << 0x40 - (bVar1 & 0x3f);
      uVar3 = s->_q_ZMMReg[1] >> (bVar1 & 0x3f);
LAB_00510d5e:
      uVar3 = d->_q_ZMMReg[0] << (-bVar1 & 0x3f) | uVar3;
    }
LAB_00510de2:
    uVar6 = 0;
  }
  else if (uVar2 - 1 < 0x7f) {
    if (uVar2 < 0x41) {
      uVar4 = s->_q_ZMMReg[1] << (-bVar1 & 0x3f);
      uVar3 = 0;
      goto LAB_00510d5e;
    }
    uVar4 = s->_q_ZMMReg[1] >> (bVar1 - 0x40 & 0x3f) | d->_q_ZMMReg[0] << (-bVar1 & 0x3f);
    uVar3 = d->_q_ZMMReg[0] >> (bVar1 - 0x40 & 0x3f);
LAB_00510dac:
    uVar6 = d->_q_ZMMReg[1] << (-bVar1 & 0x3f);
  }
  else if (uVar2 - 0x41 < 0x7f) {
    if (uVar2 < 0x81) {
      uVar4 = d->_q_ZMMReg[0] << (-bVar1 & 0x3f);
      uVar3 = 0;
      goto LAB_00510dac;
    }
    uVar4 = d->_q_ZMMReg[0] >> (bVar1 + 0x80 & 0x3f) | d->_q_ZMMReg[1] << (-bVar1 & 0x3f);
    uVar6 = d->_q_ZMMReg[1] >> (bVar1 + 0x80 & 0x3f);
    uVar3 = 0;
  }
  else {
    if (uVar2 - 0x81 < 0x7f) {
      if (uVar2 < 0xc1) {
        uVar4 = d->_q_ZMMReg[1] << (-bVar1 & 0x3f);
      }
      else {
        uVar4 = d->_q_ZMMReg[1] >> (bVar1 + 0x40 & 0x3f);
      }
      uVar3 = 0;
      goto LAB_00510de2;
    }
    uVar4 = 0;
    uVar3 = 0;
    uVar6 = 0;
    if (0xffffff80 < uVar2) goto LAB_00510dcc;
  }
  uVar5 = uVar3 | uVar6;
LAB_00510de8:
  d->_q_ZMMReg[0] = uVar4;
  d->_q_ZMMReg[1] = uVar5;
  return;
}

Assistant:

void glue(helper_palignr, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                  int32_t shift)
{
    Reg r;

    /* XXX could be checked during translation */
    if (shift >= (16 << SHIFT)) {
        r.Q(0) = 0;
        XMM_ONLY(r.Q(1) = 0);
    } else {
        shift <<= 3;
#define SHR(v, i) (i < 64 && i > -64 ? i > 0 ? v >> (i) : (v << -(i)) : 0)
#if SHIFT == 0
        r.Q(0) = SHR(s->Q(0), shift - 0) |
            SHR(d->Q(0), shift -  64);
#else
        r.Q(0) = SHR(s->Q(0), shift - 0) |
            SHR(s->Q(1), shift -  64) |
            SHR(d->Q(0), shift - 128) |
            SHR(d->Q(1), shift - 192);
        r.Q(1) = SHR(s->Q(0), shift + 64) |
            SHR(s->Q(1), shift -   0) |
            SHR(d->Q(0), shift -  64) |
            SHR(d->Q(1), shift - 128);
#endif
#undef SHR
    }

    *d = r;
}